

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O0

Constraint *
slang::ast::UniquenessConstraint::fromSyntax(UniquenessConstraintSyntax *syntax,ASTContext *context)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  string_view arg;
  sockaddr *__addr;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int iVar4;
  RandMode RVar5;
  RangeListSyntax *pRVar6;
  ExpressionSyntax *pEVar7;
  undefined4 extraout_var;
  Symbol *pSVar8;
  Type *this;
  EVP_PKEY_CTX *src;
  sockaddr *in_RSI;
  UniquenessConstraint *result;
  Diagnostic *diag;
  RandMode mode;
  Type *symType;
  Symbol *sym;
  Expression *expr;
  ExpressionSyntax *item;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  SmallVector<const_slang::ast::Expression_*,_5UL> items;
  Type *commonType;
  bool bad;
  LanguageVersion lv;
  Compilation *comp;
  Type *in_stack_fffffffffffffd68;
  Compilation *in_stack_fffffffffffffd70;
  Type *in_stack_fffffffffffffd78;
  Compilation *this_00;
  ASTContext *in_stack_fffffffffffffd88;
  SourceLocation in_stack_fffffffffffffd90;
  SourceLocation in_stack_fffffffffffffd98;
  Diagnostic *in_stack_fffffffffffffda0;
  DiagCode DVar9;
  undefined1 in_stack_fffffffffffffdb0;
  undefined4 uVar10;
  undefined1 in_stack_fffffffffffffdb7;
  Type *in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  DeclaredType *in_stack_fffffffffffffde0;
  Type *local_110;
  bitmask<slang::ast::ASTFlags> local_c0;
  undefined8 local_b8;
  ExpressionSyntax *local_b0;
  iterator local_a8;
  iterator local_98;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *local_78;
  SmallVectorBase<const_slang::ast::Expression_*> local_70 [2];
  Type *local_30;
  byte local_25;
  LanguageVersion local_24;
  Compilation *local_20;
  sockaddr *local_18;
  UniquenessConstraint *local_8;
  
  local_18 = in_RSI;
  local_20 = ASTContext::getCompilation((ASTContext *)0x62a844);
  local_24 = Compilation::languageVersion((Compilation *)0x62a859);
  local_25 = 0;
  local_30 = (Type *)0x0;
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x62a881);
  pRVar6 = not_null<slang::syntax::RangeListSyntax_*>::operator->
                     ((not_null<slang::syntax::RangeListSyntax_*> *)0x62a892);
  local_78 = &pRVar6->valueRanges;
  local_98 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
                       ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x62a8bd);
  local_a8 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end
                       ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)
                        in_stack_fffffffffffffd70);
  do {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>_>
                      ((self_type *)in_stack_fffffffffffffd70,
                       (iterator_base<slang::syntax::ExpressionSyntax_*> *)in_stack_fffffffffffffd68
                      );
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_00 = local_20;
      SmallVectorBase<const_slang::ast::Expression_*>::copy(local_70,(EVP_PKEY_CTX *)local_20,src);
      local_8 = BumpAllocator::
                emplace<slang::ast::UniquenessConstraint,std::span<slang::ast::Expression_const*,18446744073709551615ul>>
                          (&this_00->super_BumpAllocator,
                           (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)
                           in_stack_fffffffffffffd78);
      if ((local_25 & 1) != 0) {
        local_8 = (UniquenessConstraint *)
                  Constraint::badConstraint
                            (in_stack_fffffffffffffd70,(Constraint *)in_stack_fffffffffffffd68);
      }
      SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x62af74);
      return &local_8->super_Constraint;
    }
    pEVar7 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                          *)0x62a96b);
    __addr = local_18;
    local_b0 = pEVar7;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_c0,None);
    iVar4 = Expression::bind((int)pEVar7,__addr,(socklen_t)local_c0.m_bits);
    local_b8 = CONCAT44(extraout_var,iVar4);
    SmallVectorBase<const_slang::ast::Expression_*>::push_back
              ((SmallVectorBase<const_slang::ast::Expression_*> *)in_stack_fffffffffffffd70,
               (Expression **)in_stack_fffffffffffffd68);
    bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffd70);
    if (bVar1) {
      local_25 = 1;
    }
    else {
      pSVar8 = Expression::getSymbolReference
                         ((Expression *)in_stack_fffffffffffffdb8,(bool)in_stack_fffffffffffffdb7);
      if (pSVar8 != (Symbol *)0x0) {
        Symbol::getDeclaredType(&in_stack_fffffffffffffd78->super_Symbol);
        DeclaredType::getType(in_stack_fffffffffffffde0);
        bVar1 = isAllowedForUniqueness(in_stack_fffffffffffffd68,Default);
        if (bVar1) {
          Symbol::getDeclaredType(&in_stack_fffffffffffffd78->super_Symbol);
          this = DeclaredType::getType(in_stack_fffffffffffffde0);
          local_110 = this;
          while( true ) {
            in_stack_fffffffffffffdc7 = Type::isUnpackedArray(in_stack_fffffffffffffd68);
            if (!(bool)in_stack_fffffffffffffdc7) break;
            in_stack_fffffffffffffdb8 = Type::getArrayElementType(in_stack_fffffffffffffd78);
            local_110 = in_stack_fffffffffffffdb8;
          }
          RVar5 = ASTContext::getRandMode
                            ((ASTContext *)this,
                             (Symbol *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0)
                            );
          iVar4 = RVar5 << 8;
          in_stack_fffffffffffffdb7 = (undefined1)(RVar5 >> 0x18);
          DVar9 = SUB84((ulong)in_stack_fffffffffffffda0 >> 0x20,0);
          if (RVar5 == RandC) {
            sourceRange_01.endLoc = in_stack_fffffffffffffd98;
            sourceRange_01.startLoc = in_stack_fffffffffffffd90;
            ASTContext::addDiag(in_stack_fffffffffffffd88,DVar9,sourceRange_01);
          }
          else if (RVar5 == None) {
            sourceRange_02.endLoc = in_stack_fffffffffffffd98;
            sourceRange_02.startLoc = in_stack_fffffffffffffd90;
            ASTContext::addDiag(in_stack_fffffffffffffd88,DVar9,sourceRange_02);
          }
          else if (local_30 == (Type *)0x0) {
            local_30 = local_110;
          }
          else {
            bVar1 = Type::isEquivalent(this,(Type *)CONCAT17(in_stack_fffffffffffffdc7,
                                                             in_stack_fffffffffffffdc0));
            uVar10 = CONCAT31((int3)((uint)iVar4 >> 8),bVar1);
            if ((!bVar1) && ((local_25 & 1) == 0)) {
              uVar2 = Type::isError((Type *)0x62ad8b);
              if (!(bool)uVar2) {
                uVar3 = Type::isError((Type *)0x62adac);
                if (!(bool)uVar3) {
                  sourceRange_03.endLoc = in_stack_fffffffffffffd98;
                  sourceRange_03.startLoc = in_stack_fffffffffffffd90;
                  ASTContext::addDiag(in_stack_fffffffffffffd88,
                                      SUB84((ulong)in_stack_fffffffffffffda0 >> 0x20,0),
                                      sourceRange_03);
                  arg._M_str._0_7_ = in_stack_fffffffffffffdc0;
                  arg._M_len = (size_t)in_stack_fffffffffffffdb8;
                  arg._M_str._7_1_ = in_stack_fffffffffffffdc7;
                  in_stack_fffffffffffffda0 =
                       Diagnostic::operator<<
                                 ((Diagnostic *)
                                  CONCAT17(in_stack_fffffffffffffdb7,
                                           CONCAT43(uVar10,CONCAT12(uVar2,CONCAT11(uVar3,
                                                  in_stack_fffffffffffffdb0)))),arg);
                  in_stack_fffffffffffffd98 =
                       (SourceLocation)
                       ast::operator<<((Diagnostic *)
                                       CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0)
                                       ,in_stack_fffffffffffffdb8);
                  ast::operator<<((Diagnostic *)
                                  CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                                  in_stack_fffffffffffffdb8);
                  local_25 = 1;
                }
              }
            }
          }
          goto LAB_0062ae90;
        }
      }
      DVar9 = SUB84((ulong)in_stack_fffffffffffffda0 >> 0x20,0);
      if (pSVar8 == (Symbol *)0x0) {
        sourceRange.endLoc = in_stack_fffffffffffffd98;
        sourceRange.startLoc = in_stack_fffffffffffffd90;
        ASTContext::addDiag(in_stack_fffffffffffffd88,DVar9,sourceRange);
      }
      else {
        sourceRange_00.endLoc = in_stack_fffffffffffffd98;
        sourceRange_00.startLoc = in_stack_fffffffffffffd90;
        ASTContext::addDiag(in_stack_fffffffffffffd88,DVar9,sourceRange_00);
        in_stack_fffffffffffffde0 =
             Symbol::getDeclaredType(&in_stack_fffffffffffffd78->super_Symbol);
        DeclaredType::getType(in_stack_fffffffffffffde0);
        ast::operator<<((Diagnostic *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                        in_stack_fffffffffffffdb8);
      }
      local_25 = 1;
    }
LAB_0062ae90:
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                *)in_stack_fffffffffffffd70);
  } while( true );
}

Assistant:

Constraint& UniquenessConstraint::fromSyntax(const UniquenessConstraintSyntax& syntax,
                                             const ASTContext& context) {
    auto& comp = context.getCompilation();
    const auto lv = comp.languageVersion();

    bool bad = false;
    const Type* commonType = nullptr;
    SmallVector<const Expression*> items;
    for (auto item : syntax.ranges->valueRanges) {
        auto& expr = Expression::bind(*item, context);
        items.push_back(&expr);

        if (expr.bad()) {
            bad = true;
        }
        else {
            auto sym = expr.getSymbolReference();
            if (!sym || !isAllowedForUniqueness(sym->getDeclaredType()->getType(), lv)) {
                if (!sym) {
                    context.addDiag(diag::InvalidUniquenessExpr, expr.sourceRange);
                }
                else {
                    context.addDiag(diag::BadUniquenessType, expr.sourceRange)
                        << sym->getDeclaredType()->getType();
                }
                bad = true;
            }
            else {
                const Type* symType = &sym->getDeclaredType()->getType();
                while (symType->isUnpackedArray())
                    symType = symType->getArrayElementType();

                RandMode mode = context.getRandMode(*sym);
                if (mode == RandMode::RandC)
                    context.addDiag(diag::RandCInUnique, expr.sourceRange);
                else if (mode == RandMode::None)
                    context.addDiag(diag::InvalidUniquenessExpr, expr.sourceRange);
                else if (!commonType)
                    commonType = symType;
                else if (!commonType->isEquivalent(*symType)) {
                    // All variables used in a uniqueness constraint must have equivalent types.
                    if (!bad && !commonType->isError() && !symType->isError()) {
                        auto& diag = context.addDiag(diag::InequivalentUniquenessTypes,
                                                     expr.sourceRange);
                        diag << sym->name << *symType << *commonType;
                        bad = true;
                    }
                }
            }
        }
    }

    auto result = comp.emplace<UniquenessConstraint>(items.copy(comp));
    if (bad)
        return badConstraint(comp, result);

    return *result;
}